

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::tanh_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  undefined1 auVar1 [16];
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_01;
  size_t sVar6;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  size_t i_1;
  size_t i;
  float *in;
  float *d;
  float *g;
  ulong local_40;
  ulong local_38;
  long lVar4;
  undefined4 extraout_var_00;
  
  iVar3 = (*in_RDI->_vptr_tensor[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*in_RSI->_vptr_tensor[2])();
  lVar5 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*in_RDX->_vptr_tensor[2])();
  eVar2 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RDX);
  if (eVar2) {
    for (local_38 = 0; sVar6 = tensor::size(in_RSI), local_38 < sVar6; local_38 = local_38 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar5 + local_38 * 4)),
                               ZEXT416(*(uint *)(lVar5 + local_38 * 4) ^ 0x80000000),
                               SUB6416(ZEXT464(0x3f800000),0));
      *(float *)(lVar4 + local_38 * 4) =
           *(float *)(CONCAT44(extraout_var_01,iVar3) + local_38 * 4) * auVar1._0_4_;
    }
  }
  else {
    for (local_40 = 0; sVar6 = tensor::size(in_RSI), local_40 < sVar6; local_40 = local_40 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar5 + local_40 * 4)),
                               ZEXT416(*(uint *)(lVar5 + local_40 * 4) ^ 0x80000000),
                               SUB6416(ZEXT464(0x3f800000),0));
      auVar1 = vfmadd213ss_fma(auVar1,ZEXT416(*(uint *)(CONCAT44(extraout_var_01,iVar3) +
                                                       local_40 * 4)),
                               ZEXT416(*(uint *)(lVar4 + local_40 * 4)));
      *(int *)(lVar4 + local_40 * 4) = auVar1._0_4_;
    }
  }
  return;
}

Assistant:

void tanh_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const auto g = grad.host();
            const auto d = dest.host();
            const auto in = gradient_input.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] = in[i]*(1-d[i]*d[i]);
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] += in[i]*(1-d[i]*d[i]);
            }
        }